

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

Type __thiscall de::FilePath::getType(FilePath *this)

{
  int iVar1;
  Type TVar2;
  FilePath normPath;
  stat st;
  
  normalize(&normPath,this);
  iVar1 = stat(normPath.m_path._M_dataplus._M_p,(stat *)&st);
  TVar2 = TYPE_UNKNOWN;
  if (iVar1 == 0) {
    TVar2 = TYPE_FILE;
    if ((st.st_mode & 0xf000) != 0x8000) {
      TVar2 = (uint)((st.st_mode & 0xf000) == 0x4000) * 2;
    }
  }
  std::__cxx11::string::~string((string *)&normPath);
  return TVar2;
}

Assistant:

FilePath::Type FilePath::getType (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);

	if (result != 0)
		return TYPE_UNKNOWN;

	int type = st.st_mode & S_IFMT;
	if (type == S_IFREG)
		return TYPE_FILE;
	else if (type == S_IFDIR)
		return TYPE_DIRECTORY;
	else
		return TYPE_UNKNOWN;
}